

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::CreateContextNoConfigCase::iterate(CreateContextNoConfigCase *this)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  deUint32 err_00;
  Library *egl_00;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar4;
  EGLDisplay pvVar5;
  NotSupportedError *this_00;
  TestError *this_01;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_6b0;
  char *local_530;
  Hex<16UL> local_528;
  MessageBuilder local_520;
  int local_39c;
  void *pvStack_398;
  EGLenum err;
  EGLContext context;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  MessageBuilder local_1f0;
  int local_6c;
  int local_68;
  EGLenum api;
  int apiNdx;
  TestLog *local_30;
  TestLog *log;
  UniqueDisplay display;
  Library *egl;
  CreateContextNoConfigCase *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display.m_display = egl_00;
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar4 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay((UniqueDisplay *)&log,egl_00,pvVar4);
  local_30 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pvVar4 = display.m_display;
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&log);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&apiNdx,"EGL_KHR_no_config_context",(allocator<char> *)((long)&api + 3));
  bVar1 = eglu::hasExtension((Library *)pvVar4,pvVar5,(string *)&apiNdx);
  std::__cxx11::string::~string((string *)&apiNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&api + 3));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"EGL_KHR_no_config_context is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
               ,0x81);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "pass");
  local_68 = 0;
  do {
    if (4 < local_68) {
      eglu::UniqueDisplay::~UniqueDisplay((UniqueDisplay *)&log);
      return STOP;
    }
    local_6c = *(int *)(s_apis + (long)local_68 * 0x18 + 8);
    iVar2 = (*(code *)**display.m_display)(display.m_display,local_6c);
    if (iVar2 == 0) {
      do {
        dVar3 = ::deGetFalse();
        if ((dVar3 != 0) || (iVar2 = (**(code **)(*display.m_display + 0xf8))(), iVar2 != 0x300c)) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,(char *)0x0,"egl.getError() == EGL_BAD_PARAMETER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                     ,0x8b);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      tcu::TestLog::operator<<(&local_1f0,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [12])"eglBindAPI(");
      EVar7 = eglu::getAPIStr(local_6c);
      local_210 = EVar7.m_getName;
      local_208 = EVar7.m_value;
      local_200.m_getName = local_210;
      local_200.m_value = local_208;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_200);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])") failed, skipping");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f0);
    }
    else {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&context,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&context,(char (*) [10])"Creating ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)(s_apis + (long)local_68 * 0x18));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2b5150d);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&context);
      pvVar4 = display.m_display;
      pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&log);
      pvStack_398 = (void *)(**(code **)(*pvVar4 + 0x30))
                                      (pvVar4,pvVar5,0,0,
                                       *(undefined8 *)(s_apis + (long)local_68 * 0x18 + 0x10));
      local_39c = (**(code **)(*display.m_display + 0xf8))();
      if ((pvStack_398 == (void *)0x0) || (local_39c != 0x3000)) {
        tcu::TestLog::operator<<(&local_520,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_520,(char (*) [18])"  Fail, context: ");
        local_528 = tcu::toHex<void_*>(pvStack_398);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_528);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])", error: ");
        local_530 = eglu::getErrorName(local_39c);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_530);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_520);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Failed to create context");
      }
      else {
        do {
          pvVar4 = display.m_display;
          pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&log);
          (**(code **)(*pvVar4 + 0x98))(pvVar4,pvVar5,pvStack_398);
          err_00 = (**(code **)(*display.m_display + 0xf8))();
          eglu::checkError(err_00,"destroyContext(*display, context)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                           ,0x9d);
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
        tcu::TestLog::operator<<(&local_6b0,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_6b0,(char (*) [7])"  Pass");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6b0);
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const eglw::Library&		egl		= m_eglTestCtx.getLibrary();
		const eglu::UniqueDisplay	display	(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay(), DE_NULL));
		tcu::TestLog&				log		= m_testCtx.getLog();

		if (!eglu::hasExtension(egl, *display, "EGL_KHR_no_config_context"))
			TCU_THROW(NotSupportedError, "EGL_KHR_no_config_context is not supported");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "pass");

		for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(s_apis); apiNdx++)
		{
			const EGLenum	api		= s_apis[apiNdx].api;

			if (egl.bindAPI(api) == EGL_FALSE)
			{
				TCU_CHECK(egl.getError() == EGL_BAD_PARAMETER);
				log << TestLog::Message << "eglBindAPI(" << eglu::getAPIStr(api) << ") failed, skipping" << TestLog::EndMessage;
				continue;
			}

			log << TestLog::Message << "Creating " << s_apis[apiNdx].name << " context" << TestLog::EndMessage;

			const EGLContext	context = egl.createContext(*display, (EGLConfig)0, EGL_NO_CONTEXT, s_apis[apiNdx].ctxAttrs);
			const EGLenum		err		= egl.getError();

			if (context == EGL_NO_CONTEXT || err != EGL_SUCCESS)
			{
				log << TestLog::Message << "  Fail, context: " << tcu::toHex(context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to create context");
			}
			else
			{
				// Destroy
				EGLU_CHECK_CALL(egl, destroyContext(*display, context));
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
			}
		}

		return STOP;
	}